

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O3

string * __thiscall
ut11::Operands::EqualTo<std::__cxx11::string>::GetErrorMessage<std::__cxx11::string>
          (string *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  long lVar1;
  pointer pcVar2;
  ostream *poVar3;
  stringstream errorMessage;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Expected ",9);
  lVar1 = **this;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,lVar1,(*this)[1] + lVar1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," but was ",9);
  pcVar2 = (actual->_M_dataplus)._M_p;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + actual->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1f0,local_1e8);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}